

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O3

char * test_matrix2_identity_with_vector(void)

{
  int iVar1;
  char *pcVar2;
  vector2 expectedPosition;
  vector2 startingPosition;
  matrix2 m;
  anon_union_8_2_12391dad_for_vector2_0 local_38;
  anon_union_8_2_12391dad_for_vector2_0 local_30;
  matrix2 local_28;
  
  local_30 = (anon_union_8_2_12391dad_for_vector2_0)0x3fb333334089999a;
  local_38 = (anon_union_8_2_12391dad_for_vector2_0)0x3fb333334089999a;
  matrix2_identity(&local_28);
  vector2_multiplym2((vector2 *)&local_30.field_1,&local_28);
  iVar1 = vector2_equals((vector2 *)&local_30.field_1,(vector2 *)&local_38.field_1);
  pcVar2 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(209) : (assertion failed) ((vector2_equals(&startingPosition, &expectedPosition)))"
    ;
  }
  return pcVar2;
}

Assistant:

static char *test_matrix2_identity_with_vector(void)
{
	/* vector * identity_matrix = vector */
	struct matrix2 m;
	struct vector2 startingPosition = {4.3f, 1.4f};
	struct vector2 expectedPosition = {4.3f, 1.4f};

	matrix2_identity(&m);

	vector2_multiplym2(&startingPosition, &m);
	test_assert(vector2_equals(&startingPosition, &expectedPosition));

	return NULL;
}